

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall
CTcPrsOpArith::eval_constant(CTcPrsOpArith *this,CTcPrsNode *left,CTcPrsNode *right)

{
  void *pvVar1;
  int iVar2;
  tc_toktyp_t op;
  undefined4 extraout_var;
  long lVar3;
  long lVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  CTcConstVal *pCVar5;
  vbignum_t *pvVar6;
  char *pcVar7;
  long *in_RDX;
  CTcPrsNode *in_RSI;
  CTcPrsOpBin *in_RDI;
  vbignum_t *c_3;
  vbignum_t b_3;
  vbignum_t a_3;
  vbignum_t *c_2;
  vbignum_t b_2;
  vbignum_t a_2;
  vbignum_t *c_1;
  vbignum_t b_1;
  vbignum_t a_1;
  vbignum_t *c;
  vbignum_t b;
  vbignum_t a;
  long r;
  int ov;
  tc_constval_type_t typ2;
  tc_constval_type_t typ1;
  CTcConstVal *c2;
  CTcConstVal *c1;
  long in_stack_fffffffffffffe68;
  CTcConstVal *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  vbignum_t *in_stack_fffffffffffffe88;
  vbignum_t *val;
  CTcConstVal *in_stack_fffffffffffffe90;
  CTcConstVal *in_stack_fffffffffffffea0;
  undefined1 local_b0 [4];
  undefined1 local_a8 [8];
  CTcConstVal *local_a0;
  undefined1 local_98 [8];
  undefined1 local_90 [8];
  void *local_88;
  undefined1 local_80 [8];
  undefined1 local_78 [8];
  void *local_70;
  undefined1 local_58 [8];
  undefined1 local_50 [8];
  long local_48;
  int local_3c;
  tc_constval_type_t local_38;
  tc_constval_type_t local_34;
  CTcConstVal *local_30;
  CTcConstVal *local_28;
  long *local_20;
  CTcPrsNode *local_18;
  CTcPrsNode *local_8;
  undefined4 extraout_var_04;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  iVar2 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x2a5e6c);
  if ((iVar2 == 0) || (iVar2 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x2a5e82), iVar2 == 0)) {
    local_8 = (CTcPrsNode *)0x0;
  }
  else {
    iVar2 = (*(local_18->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
    local_28 = (CTcConstVal *)CONCAT44(extraout_var,iVar2);
    local_30 = (CTcConstVal *)(**(code **)(*local_20 + 8))();
    local_34 = CTcConstVal::get_type(local_28);
    local_38 = CTcConstVal::get_type(local_30);
    if ((local_34 == TC_CVT_INT) && (local_38 == TC_CVT_INT)) {
      lVar3 = CTcConstVal::get_val_int(local_28);
      lVar4 = CTcConstVal::get_val_int(local_30);
      iVar2 = (*(in_RDI->super_CTcPrsOp)._vptr_CTcPrsOp[3])(in_RDI,lVar3,lVar4,&local_3c);
      local_48 = CONCAT44(extraout_var_00,iVar2);
      if (local_3c == 0) {
        CTcConstVal::set_int(local_28,local_48);
      }
      else {
        CTcConstVal::get_val_int(local_28);
        vbignum_t::vbignum_t((vbignum_t *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        CTcConstVal::get_val_int(local_30);
        vbignum_t::vbignum_t((vbignum_t *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        iVar2 = (*(in_RDI->super_CTcPrsOp)._vptr_CTcPrsOp[4])(in_RDI,local_50,local_58);
        local_70 = (void *)CONCAT44(extraout_var_01,iVar2);
        if ((local_70 != (void *)0x0) &&
           (CTcConstVal::set_float
                      (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe84
                      ), pvVar1 = local_70, local_70 != (void *)0x0)) {
          vbignum_t::~vbignum_t((vbignum_t *)in_stack_fffffffffffffe70);
          operator_delete(pvVar1,8);
        }
        vbignum_t::~vbignum_t((vbignum_t *)in_stack_fffffffffffffe70);
        vbignum_t::~vbignum_t((vbignum_t *)in_stack_fffffffffffffe70);
      }
    }
    else if ((local_34 == TC_CVT_FLOAT) && (local_38 == TC_CVT_FLOAT)) {
      CTcConstVal::get_val_float(local_28);
      iVar2 = (int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
      CTcConstVal::get_val_float_len(local_28);
      vbignum_t::vbignum_t
                ((vbignum_t *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 in_stack_fffffffffffffe78,(size_t)in_stack_fffffffffffffe70,iVar2);
      CTcConstVal::get_val_float(local_30);
      CTcConstVal::get_val_float_len(local_30);
      vbignum_t::vbignum_t
                ((vbignum_t *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 in_stack_fffffffffffffe78,(size_t)in_stack_fffffffffffffe70,iVar2);
      iVar2 = (*(in_RDI->super_CTcPrsOp)._vptr_CTcPrsOp[4])(in_RDI,local_78,local_80);
      local_88 = (void *)CONCAT44(extraout_var_02,iVar2);
      if (local_88 != (void *)0x0) {
        iVar2 = CTcConstVal::is_promoted(local_28);
        if (iVar2 != 0) {
          CTcConstVal::is_promoted(local_30);
        }
        CTcConstVal::set_float
                  (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe84);
        pvVar1 = local_88;
        if (local_88 != (void *)0x0) {
          vbignum_t::~vbignum_t((vbignum_t *)in_stack_fffffffffffffe70);
          operator_delete(pvVar1,8);
        }
        CTcConstVal::demote_float(in_stack_fffffffffffffea0);
      }
      vbignum_t::~vbignum_t((vbignum_t *)in_stack_fffffffffffffe70);
      vbignum_t::~vbignum_t((vbignum_t *)in_stack_fffffffffffffe70);
    }
    else if ((local_34 == TC_CVT_FLOAT) && (local_38 == TC_CVT_INT)) {
      CTcConstVal::get_val_float(local_28);
      CTcConstVal::get_val_float_len(local_28);
      vbignum_t::vbignum_t
                ((vbignum_t *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 in_stack_fffffffffffffe78,(size_t)in_stack_fffffffffffffe70,
                 (int)((ulong)in_stack_fffffffffffffe68 >> 0x20));
      CTcConstVal::get_val_int(local_30);
      vbignum_t::vbignum_t((vbignum_t *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      iVar2 = (*(in_RDI->super_CTcPrsOp)._vptr_CTcPrsOp[4])(in_RDI,local_90,local_98);
      local_a0 = (CTcConstVal *)CONCAT44(extraout_var_03,iVar2);
      if (local_a0 != (CTcConstVal *)0x0) {
        CTcConstVal::is_promoted(local_28);
        CTcConstVal::set_float
                  (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe84);
        pCVar5 = local_a0;
        if (local_a0 != (CTcConstVal *)0x0) {
          vbignum_t::~vbignum_t((vbignum_t *)in_stack_fffffffffffffe70);
          operator_delete(pCVar5,8);
        }
        CTcConstVal::demote_float(pCVar5);
      }
      vbignum_t::~vbignum_t((vbignum_t *)in_stack_fffffffffffffe70);
      vbignum_t::~vbignum_t((vbignum_t *)in_stack_fffffffffffffe70);
    }
    else {
      if ((local_34 != TC_CVT_INT) || (local_38 != TC_CVT_FLOAT)) {
        op = CTcPrsOpBin::get_op_tok(in_RDI);
        pcVar7 = CTcTokenizer::get_op_text(op);
        CTcTokenizer::log_error(0x2b02,pcVar7);
        return (CTcPrsNode *)0x0;
      }
      CTcConstVal::get_val_int(local_28);
      vbignum_t::vbignum_t((vbignum_t *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      iVar2 = (int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
      CTcConstVal::get_val_float(local_30);
      pCVar5 = (CTcConstVal *)CTcConstVal::get_val_float_len(local_30);
      vbignum_t::vbignum_t
                ((vbignum_t *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 in_stack_fffffffffffffe78,(size_t)in_stack_fffffffffffffe70,iVar2);
      iVar2 = (*(in_RDI->super_CTcPrsOp)._vptr_CTcPrsOp[4])(in_RDI,local_a8,local_b0);
      pvVar6 = (vbignum_t *)CONCAT44(extraout_var_04,iVar2);
      if (pvVar6 != (vbignum_t *)0x0) {
        in_stack_fffffffffffffe70 = local_28;
        val = pvVar6;
        iVar2 = CTcConstVal::is_promoted(local_30);
        CTcConstVal::set_float(pCVar5,val,iVar2);
        if (pvVar6 != (vbignum_t *)0x0) {
          vbignum_t::~vbignum_t((vbignum_t *)in_stack_fffffffffffffe70);
          operator_delete(pvVar6,8);
        }
        CTcConstVal::demote_float(in_stack_fffffffffffffea0);
      }
      vbignum_t::~vbignum_t((vbignum_t *)in_stack_fffffffffffffe70);
      vbignum_t::~vbignum_t((vbignum_t *)in_stack_fffffffffffffe70);
    }
    local_8 = local_18;
  }
  return local_8;
}

Assistant:

CTcPrsNode *CTcPrsOpArith::eval_constant(CTcPrsNode *left,
                                         CTcPrsNode *right) const
{
    /* check for constants */
    if (left->is_const() && right->is_const())
    {
        CTcConstVal *c1 = left->get_const_val();
        CTcConstVal *c2 = right->get_const_val();
        tc_constval_type_t typ1 = c1->get_type();
        tc_constval_type_t typ2 = c2->get_type();

        /* check for ints, floats, or a combination */
        if (typ1 == TC_CVT_INT && typ2 == TC_CVT_INT)
        {
            /* calculate the int result */
            int ov;
            long r = calc_result(c1->get_val_int(), c2->get_val_int(), ov);

            /* on overflow, recalculate using BigNumbers */
            if (ov)
            {
                /* calculate the BigNumber result */
                vbignum_t a(c1->get_val_int());
                vbignum_t b(c2->get_val_int());
                vbignum_t *c = calc_result(a, b);

                /* if successful, assign it back to the left operand */
                if (c != 0)
                {
                    c1->set_float(c, TRUE);
                    delete c;
                }
            }
            else
            {
                /* success - assign the folded int to the left operand */
                c1->set_int(r);
            }
        }
        else if (typ1 == TC_CVT_FLOAT && typ2 == TC_CVT_FLOAT)
        {
            /* calculate the BigNumber result */
            vbignum_t a(c1->get_val_float(), c1->get_val_float_len(), 0);
            vbignum_t b(c2->get_val_float(), c2->get_val_float_len(), 0);
            vbignum_t *c = calc_result(a, b);

            /* assign it back to the left operand */
            if (c != 0)
            {
                /* save the value and delete the calculation result */
                c1->set_float(c, c1->is_promoted() && c2->is_promoted());
                delete c;

                /* check for possible demotion back to int */
                c1->demote_float();
            }
        }
        else if (typ1 == TC_CVT_FLOAT && typ2 == TC_CVT_INT)
        {
            /* calculate the BigNumber result */
            vbignum_t a(c1->get_val_float(), c1->get_val_float_len(), 0);
            vbignum_t b(c2->get_val_int());
            vbignum_t *c = calc_result(a, b);

            /* assign it back to the left operand */
            if (c != 0)
            {
                /* save the value and delete the calculation result */
                c1->set_float(c, c1->is_promoted());
                delete c;

                /* check for possible demotion back to int */
                c1->demote_float();
            }
        }
        else if (typ1 == TC_CVT_INT && typ2 == TC_CVT_FLOAT)
        {
            /* calculate the BigNumber result */
            vbignum_t a(c1->get_val_int());
            vbignum_t b(c2->get_val_float(), c2->get_val_float_len(), 0);
            vbignum_t *c = calc_result(a, b);

            /* assign it back to the left operand */
            if (c != 0)
            {
                /* save the value and delete the calculation result */
                c1->set_float(c, c2->is_promoted());
                delete c;

                /* check for possible demotion back to int */
                c1->demote_float();
            }
        }
        else
        {
            /* incompatible types - log an error */
            G_tok->log_error(TCERR_CONST_BINARY_REQ_NUM,
                             G_tok->get_op_text(get_op_tok()));
            return 0;
        }

        /* return the updated left value */
        return left;
    }
    else
    {
        /* 
         *   one or the other is non-constant, so we can't fold the
         *   expression - return null to so indicate 
         */
        return 0;
    }
}